

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O2

CURLcode ssl_cf_cntrl(Curl_cfilter *cf,Curl_easy *data,int event,int arg1,void *arg2)

{
  _func__Bool_Curl_cfilter_ptr_Curl_easy_ptr *p_Var1;
  _func_void_Curl_cfilter_ptr_Curl_easy_ptr *p_Var2;
  undefined8 uVar3;
  
  if (event == 2) {
    p_Var2 = Curl_ssl->detach_data;
    if (p_Var2 == (_func_void_Curl_cfilter_ptr_Curl_easy_ptr *)0x0) {
      return CURLE_OK;
    }
    uVar3 = *(undefined8 *)((long)cf->ctx + 0x38);
    *(Curl_easy **)((long)cf->ctx + 0x38) = data;
    (*p_Var2)(cf,data);
  }
  else {
    if (event != 1) {
      return CURLE_OK;
    }
    p_Var1 = Curl_ssl->attach_data;
    if (p_Var1 == (_func__Bool_Curl_cfilter_ptr_Curl_easy_ptr *)0x0) {
      return CURLE_OK;
    }
    uVar3 = *(undefined8 *)((long)cf->ctx + 0x38);
    *(Curl_easy **)((long)cf->ctx + 0x38) = data;
    (*p_Var1)(cf,data);
  }
  *(undefined8 *)((long)cf->ctx + 0x38) = uVar3;
  return CURLE_OK;
}

Assistant:

static CURLcode ssl_cf_cntrl(struct Curl_cfilter *cf,
                             struct Curl_easy *data,
                             int event, int arg1, void *arg2)
{
  struct cf_call_data save;

  (void)arg1;
  (void)arg2;
  switch(event) {
  case CF_CTRL_DATA_ATTACH:
    if(Curl_ssl->attach_data) {
      CF_DATA_SAVE(save, cf, data);
      Curl_ssl->attach_data(cf, data);
      CF_DATA_RESTORE(cf, save);
    }
    break;
  case CF_CTRL_DATA_DETACH:
    if(Curl_ssl->detach_data) {
      CF_DATA_SAVE(save, cf, data);
      Curl_ssl->detach_data(cf, data);
      CF_DATA_RESTORE(cf, save);
    }
    break;
  default:
    break;
  }
  return CURLE_OK;
}